

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::Object::stAtPut(InterpreterProxy *interpreter)

{
  int iVar1;
  Oop *oopData;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  anon_union_8_4_0eb573b0_for_Oop_0 value_00;
  undefined4 extraout_var_04;
  SmallIntegerValue SVar2;
  SmallIntegerValue SVar3;
  undefined4 extraout_var_05;
  void *pvVar4;
  uint64_t uVar5;
  _func_int **pp_Var6;
  uint uVar7;
  Oop value;
  Oop self;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  Oop indexOop;
  undefined4 extraout_var_03;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 2) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  (*interpreter->_vptr_InterpreterProxy[1])(interpreter,CONCAT44(extraout_var_00,iVar1));
  iVar1 = stSize(interpreter);
  if (iVar1 != 0) {
    return iVar1;
  }
  self.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  self.field_0.uintValue._4_4_ = extraout_var_01;
  indexOop.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  indexOop.field_0.uintValue._4_4_ = extraout_var_02;
  value_00._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,1);
  value_00.uintValue._4_4_ = extraout_var_03;
  value.field_0 = value_00;
  local_40._0_4_ = (*interpreter->_vptr_InterpreterProxy[6])(interpreter);
  local_40.uintValue._4_4_ = extraout_var_04;
  SVar2 = Oop::decodeSmallInteger((Oop *)&local_40);
  SVar3 = Oop::decodeSmallInteger(&indexOop);
  pp_Var6 = interpreter->_vptr_InterpreterProxy;
  if ((SVar3 < 1) || (SVar2 < SVar3 + -1)) {
LAB_0014c288:
    iVar1 = (*pp_Var6[0x1e])(interpreter);
  }
  else {
    iVar1 = (**pp_Var6)(interpreter);
    pvVar4 = Oop::getFirstIndexableFieldPointer(&self,(VMContext *)CONCAT44(extraout_var_05,iVar1));
    uVar7 = (uint)((ulong)*(undefined8 *)self.field_0 >> 0x23) & 0x1f;
    if (uVar7 < 9) {
      *(anon_union_8_4_0eb573b0_for_Oop_0 *)((long)pvVar4 + SVar3 * 8 + -8) = value_00;
    }
    else if (uVar7 < 0x10) {
      if (uVar7 < 0xc) {
        if (uVar7 == 9) {
          uVar5 = VMContext::positiveInt64ValueOf
                            ((VMContext *)CONCAT44(extraout_var_05,iVar1),(Oop)value_00);
          *(uint64_t *)((long)pvVar4 + SVar3 * 8 + -8) = uVar5;
        }
        else {
          if ((value_00._0_4_ & 1) == 0) goto LAB_0014c285;
          SVar2 = Oop::decodeSmallInteger(&value);
          *(int *)((long)pvVar4 + SVar3 * 4 + -4) = (int)SVar2;
        }
      }
      else {
        if ((value_00._0_4_ & 1) == 0) goto LAB_0014c285;
        SVar2 = Oop::decodeSmallInteger(&value);
        *(short *)((long)pvVar4 + SVar3 * 2 + -2) = (short)SVar2;
      }
    }
    else {
      if ((value_00._0_4_ & 1) == 0) {
LAB_0014c285:
        pp_Var6 = interpreter->_vptr_InterpreterProxy;
        goto LAB_0014c288;
      }
      SVar2 = Oop::decodeSmallInteger(&value);
      *(char *)((long)pvVar4 + SVar3 + -1) = (char)SVar2;
    }
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,value.field_0);
  }
  return iVar1;
}

Assistant:

int Object::stAtPut(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 2)
        return interpreter->primitiveFailed();

    interpreter->pushOop(interpreter->getReceiver());
    auto error = stSize(interpreter);
    if(error != 0)
        return error;

    auto self = interpreter->getReceiver();
    auto indexOop = interpreter->getTemporary(0);
    auto value = interpreter->getTemporary(1);
	auto size = interpreter->popOop().decodeSmallInteger();
	auto index = indexOop.decodeSmallInteger() - 1;
	if(index > size || index < 0)
		return interpreter->primitiveFailed();

    // Set the element.
    auto context = interpreter->getContext();
    auto firstIndexableField = self.getFirstIndexableFieldPointer(context);
    auto format = self.header->objectFormat;
    if(format < OF_INDEXABLE_64)
    {
        auto oopData = reinterpret_cast<Oop*> (firstIndexableField);
        oopData[index] = value;
    }
    else if(format >= OF_INDEXABLE_8)
    {
        auto data = reinterpret_cast<uint8_t*> (firstIndexableField);
        if(!value.isSmallInteger())
            return interpreter->primitiveFailed();

        data[index] = (uint8_t)value.decodeSmallInteger();
    }
    else if(format >= OF_INDEXABLE_16)
    {
        auto data = reinterpret_cast<uint16_t*> (firstIndexableField);
        if(!value.isSmallInteger())
            return interpreter->primitiveFailed();

        data[index] = (uint16_t)value.decodeSmallInteger();
    }
    else if(format >= OF_INDEXABLE_32)
    {
        auto data = reinterpret_cast<uint32_t*> (firstIndexableField);
#ifdef OBJECT_MODEL_SPUR_64
        if(!value.isSmallInteger())
            return interpreter->primitiveFailed();

        data[index] = (uint32_t)value.decodeSmallInteger();
#else
        data[index] = (uint32_t)context->positiveInt32ValueOf(value);
#endif
    }
    else if(format == OF_INDEXABLE_64)
    {
        auto data = reinterpret_cast<uint64_t*> (firstIndexableField);
        data[index] = context->positiveInt64ValueOf(value);
    }
    else
    {
    	nativeError("unimplemented");
    }

    return interpreter->returnOop(value);
}